

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

int aom_vector_var_c(int16_t *ref,int16_t *src,int bwl)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  bVar1 = (byte)bwl & 0x1f;
  uVar5 = 0;
  uVar3 = (ulong)(uint)(4 << bVar1);
  if (4 << bVar1 < 1) {
    uVar3 = uVar5;
  }
  iVar4 = 0;
  iVar2 = 0;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    iVar6 = (int)ref[uVar5] - (int)src[uVar5];
    iVar4 = iVar4 + iVar6;
    iVar2 = iVar2 + iVar6 * iVar6;
  }
  return iVar2 - ((uint)(iVar4 * iVar4) >> ((byte)bwl + 2 & 0x1f));
}

Assistant:

int aom_vector_var_c(const int16_t *ref, const int16_t *src, int bwl) {
  int i;
  int width = 4 << bwl;
  int sse = 0, mean = 0, var;

  for (i = 0; i < width; ++i) {
    int diff = ref[i] - src[i];  // diff: dynamic range [-510, 510], 10 bits.
    mean += diff;                // mean: dynamic range 16 bits.
    sse += diff * diff;          // sse:  dynamic range 26 bits.
  }

  // (mean * mean): dynamic range 31 bits.
  // If width == 128, the mean can be 510 * 128 = 65280, and log2(65280 ** 2) ~=
  // 31.99, so it needs to be casted to unsigned int to compute its square.
  const unsigned int mean_abs = abs(mean);
  var = sse - ((mean_abs * mean_abs) >> (bwl + 2));
  return var;
}